

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O0

Vec_Vec_t * Aig_ManLevelize(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Vec_t *p_00;
  void *Entry;
  int local_28;
  int i;
  int nLevels;
  Vec_Vec_t *vLevels;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManLevelNum(p);
  p_00 = Vec_VecStart(iVar1 + 1);
  local_28 = 0;
  do {
    iVar2 = Vec_PtrSize(p->vObjs);
    if (iVar2 <= local_28) {
      return p_00;
    }
    Entry = Vec_PtrEntry(p->vObjs,local_28);
    if (Entry != (void *)0x0) {
      if (iVar1 < (int)((uint)((ulong)*(undefined8 *)((long)Entry + 0x18) >> 0x20) & 0xffffff)) {
        __assert_fail("(int)pObj->Level <= nLevels",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                      ,0x13c,"Vec_Vec_t *Aig_ManLevelize(Aig_Man_t *)");
      }
      Vec_VecPush(p_00,(uint)((ulong)*(undefined8 *)((long)Entry + 0x18) >> 0x20) & 0xffffff,Entry);
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

Vec_Vec_t * Aig_ManLevelize( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    Vec_Vec_t * vLevels;
    int nLevels, i;
    nLevels = Aig_ManLevelNum( p );
    vLevels = Vec_VecStart( nLevels + 1 );
    Aig_ManForEachObj( p, pObj, i )
    {
        assert( (int)pObj->Level <= nLevels );
        Vec_VecPush( vLevels, pObj->Level, pObj );
    }
    return vLevels;
}